

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall
mkvparser::CuePoint::TrackPosition::Parse
          (TrackPosition *this,IMkvReader *pReader,longlong start_,longlong size_)

{
  longlong lVar1;
  longlong size_00;
  longlong size;
  longlong id;
  long len;
  longlong pos;
  longlong stop;
  longlong size__local;
  longlong start__local;
  IMkvReader *pReader_local;
  TrackPosition *this_local;
  
  pos = start_ + size_;
  this->m_track = -1;
  this->m_pos = -1;
  this->m_block = 1;
  len = start_;
  stop = size_;
  size__local = start_;
  start__local = (longlong)pReader;
  pReader_local = (IMkvReader *)this;
  while( true ) {
    if (pos <= len) {
      if ((this->m_pos < 0) || (this->m_track < 1)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    lVar1 = ReadID((IMkvReader *)start__local,len,&id);
    if ((lVar1 < 0) || (pos < len + id)) break;
    len = id + len;
    size_00 = ReadUInt((IMkvReader *)start__local,len,&id);
    if ((size_00 < 0) || (pos < len + id)) {
      return false;
    }
    len = id + len;
    if (pos < len + size_00) {
      return false;
    }
    if (lVar1 == 0xf7) {
      lVar1 = UnserializeUInt((IMkvReader *)start__local,len,size_00);
      this->m_track = lVar1;
    }
    else if (lVar1 == 0xf1) {
      lVar1 = UnserializeUInt((IMkvReader *)start__local,len,size_00);
      this->m_pos = lVar1;
    }
    else if (lVar1 == 0x5378) {
      lVar1 = UnserializeUInt((IMkvReader *)start__local,len,size_00);
      this->m_block = lVar1;
    }
    len = size_00 + len;
  }
  return false;
}

Assistant:

bool CuePoint::TrackPosition::Parse(IMkvReader* pReader, long long start_,
                                    long long size_) {
  const long long stop = start_ + size_;
  long long pos = start_;

  m_track = -1;
  m_pos = -1;
  m_block = 1;  // default

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTrack)
      m_track = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueClusterPosition)
      m_pos = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueBlockNumber)
      m_block = UnserializeUInt(pReader, pos, size);

    pos += size;  // consume payload
  }

  if ((m_pos < 0) || (m_track <= 0)) {
    return false;
  }

  return true;
}